

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_gtk.cxx
# Opt level: O1

void gtk_round_up_box(int x,int y,int w,int h,Fl_Color c)

{
  uint uVar1;
  Fl_Color FVar2;
  _func_int **pp_Var4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar3;
  
  Fl::set_box_color(c);
  iVar6 = 2;
  if (w < 5) {
    iVar6 = (w - (w + -1 >> 0x1f)) + -1 >> 1;
  }
  if (h <= iVar6 * 2) {
    iVar6 = (h - (h + -1 >> 0x1f)) + -1 >> 1;
  }
  uVar8 = w + iVar6 * -2;
  uVar11 = h + iVar6 * -2;
  uVar10 = uVar8;
  if (h < w) {
    uVar10 = uVar11;
  }
  if (1 < (int)uVar10) {
    uVar1 = x + iVar6;
    uVar3 = (ulong)uVar1;
    uVar7 = iVar6 + y;
    iVar6 = -0x5a;
    if (w <= h) {
      iVar6 = 0;
    }
    iVar9 = 0xb4;
    if (h < w) {
      iVar9 = 0x5a;
    }
    iVar5 = 0x168;
    if (h < w) {
      iVar5 = 0x10e;
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
              ((double)iVar6,fl_graphics_driver,(ulong)((uVar1 + uVar8) - uVar10),(ulong)uVar7,
               (ulong)uVar10,(ulong)uVar10);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
              ((double)iVar9,(double)iVar5,fl_graphics_driver,uVar3,
               (ulong)((uVar11 + uVar7) - uVar10),(ulong)uVar10,(ulong)uVar10);
    if (w < h) {
      uVar7 = (uVar10 >> 1) + uVar7;
      uVar11 = uVar11 - (uVar10 & 0x7ffffffe);
      pp_Var4 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
    }
    else {
      if (w <= h) goto LAB_001994f3;
      uVar3 = (ulong)((uVar10 >> 1) + uVar1);
      uVar8 = uVar8 - (uVar10 & 0x7ffffffe);
      pp_Var4 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
    }
    (*pp_Var4[4])(fl_graphics_driver,uVar3,(ulong)uVar7,(ulong)uVar8,(ulong)uVar11);
  }
LAB_001994f3:
  FVar2 = fl_color_average(0x38,c,0.025);
  Fl::set_box_color(FVar2);
  iVar6 = x + 1;
  iVar9 = w + -2;
  draw(1,iVar6,y,iVar9,h,2);
  draw(1,x,y,w,h,3);
  FVar2 = fl_color_average(0x38,c,0.05);
  Fl::set_box_color(FVar2);
  draw(1,iVar6,y,iVar9,h,1);
  draw(1,x,y,w,h,2);
  FVar2 = fl_color_average(0x38,c,0.1);
  Fl::set_box_color(FVar2);
  draw(1,iVar6,y,iVar9,h,0);
  draw(1,x,y,w,h,1);
  FVar2 = fl_color_average(0xff,c,0.1);
  Fl::set_box_color(FVar2);
  draw(0,x,y,w,h,4);
  draw(0,iVar6,y,iVar9,h,3);
  FVar2 = fl_color_average(0xff,c,0.2);
  Fl::set_box_color(FVar2);
  draw(0,x,y,w,h,3);
  draw(0,iVar6,y,iVar9,h,2);
  FVar2 = fl_color_average(0xff,c,0.4);
  Fl::set_box_color(FVar2);
  draw(0,x,y,w,h,2);
  draw(0,iVar6,y,iVar9,h,1);
  FVar2 = fl_color_average(0xff,c,0.5);
  Fl::set_box_color(FVar2);
  draw(0,x,y,w,h,1);
  draw(0,iVar6,y,iVar9,h,0);
  FVar2 = fl_color_average(0x38,c,0.5);
  Fl::set_box_color(FVar2);
  draw(2,x,y,w,h,0);
  return;
}

Assistant:

static void gtk_round_up_box(int x, int y, int w, int h, Fl_Color c) {
  gtk_color(c);
  draw(FILL,	    x,   y, w,   h, 2);

  gtk_color(fl_color_average(FL_BLACK, c, 0.025f));
  draw(LOWER_RIGHT, x+1, y, w-2, h, 2);
  draw(LOWER_RIGHT, x,   y, w,   h, 3);
  gtk_color(fl_color_average(FL_BLACK, c, 0.05f));
  draw(LOWER_RIGHT, x+1, y, w-2, h, 1);
  draw(LOWER_RIGHT, x,   y, w,   h, 2);
  gtk_color(fl_color_average(FL_BLACK, c, 0.1f));
  draw(LOWER_RIGHT, x+1, y, w-2, h, 0);
  draw(LOWER_RIGHT, x,   y, w,   h, 1);

  gtk_color(fl_color_average(FL_WHITE, c, 0.1f));
  draw(UPPER_LEFT,  x,   y, w,   h, 4);
  draw(UPPER_LEFT,  x+1, y, w-2, h, 3);
  gtk_color(fl_color_average(FL_WHITE, c, 0.2f));
  draw(UPPER_LEFT,  x,   y, w,   h, 3);
  draw(UPPER_LEFT,  x+1, y, w-2, h, 2);
  gtk_color(fl_color_average(FL_WHITE, c, 0.4f));
  draw(UPPER_LEFT,  x,   y, w,   h, 2);
  draw(UPPER_LEFT,  x+1, y, w-2, h, 1);
  gtk_color(fl_color_average(FL_WHITE, c, 0.5f));
  draw(UPPER_LEFT,  x,   y, w,   h, 1);
  draw(UPPER_LEFT,  x+1, y, w-2, h, 0);

  gtk_color(fl_color_average(FL_BLACK, c, 0.5f));
  draw(CLOSED,	    x,   y, w,   h, 0);
}